

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O3

bool deqp::gles2::Functional::compareToConstantColor
               (TestLog *log,char *imageSetName,char *imageSetDesc,Surface *result,
               CompareLogMode logMode,RGBA color)

{
  ostringstream *this;
  uint uVar1;
  bool bVar2;
  void *__buf;
  void *__buf_00;
  int iVar3;
  int iVar4;
  Surface *pSVar5;
  int iVar6;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  LogImageSet local_1f0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  if (0 < *(int *)(imageSetName + 4)) {
    uVar1 = *(uint *)imageSetName;
    result = (Surface *)(ulong)uVar1;
    bVar2 = true;
    iVar3 = 0;
    iVar4 = 0;
    do {
      pSVar5 = result;
      iVar6 = iVar3;
      if (0 < (int)uVar1) {
        do {
          bVar2 = (bool)(bVar2 & *(int *)(*(long *)(imageSetName + 8) + (long)iVar6 * 4) ==
                                 (int)imageSetDesc);
          iVar6 = iVar6 + 1;
          pSVar5 = (Surface *)((long)&pSVar5[-1].m_pixels.m_cap + 7);
        } while (pSVar5 != (Surface *)0x0);
      }
      iVar4 = iVar4 + 1;
      iVar3 = iVar3 + uVar1;
    } while (iVar4 != *(int *)(imageSetName + 4));
    if (!bVar2) {
      this = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"Image comparison failed",0x17);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base(local_138);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Result","");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"Image comparison result","");
      tcu::LogImageSet::LogImageSet(&local_1f0,&local_210,&local_230);
      tcu::TestLog::startImageSet
                (log,local_1f0.m_name._M_dataplus._M_p,local_1f0.m_description._M_dataplus._M_p);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Result","");
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Result","");
      tcu::LogImage::LogImage
                ((LogImage *)local_1b0,&local_250,&local_270,(Surface *)imageSetName,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf_00,(size_t)imageSetName);
      tcu::TestLog::endImageSet(log);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != local_180) {
        operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
      }
      if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.m_description._M_dataplus._M_p != &local_1f0.m_description.field_2) {
        operator_delete(local_1f0.m_description._M_dataplus._M_p,
                        local_1f0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.m_name._M_dataplus._M_p != &local_1f0.m_name.field_2) {
        operator_delete(local_1f0.m_name._M_dataplus._M_p,
                        local_1f0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Result","",result);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Image comparison result","")
  ;
  tcu::LogImageSet::LogImageSet(&local_1f0,&local_210,&local_230);
  tcu::TestLog::startImageSet
            (log,local_1f0.m_name._M_dataplus._M_p,local_1f0.m_description._M_dataplus._M_p);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Result","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Result","");
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_250,&local_270,(Surface *)imageSetName,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf,(size_t)imageSetName);
  tcu::TestLog::endImageSet(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_description._M_dataplus._M_p != &local_1f0.m_description.field_2) {
    operator_delete(local_1f0.m_description._M_dataplus._M_p,
                    local_1f0.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_name._M_dataplus._M_p != &local_1f0.m_name.field_2) {
    operator_delete(local_1f0.m_name._M_dataplus._M_p,
                    local_1f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

static bool compareToConstantColor (TestLog& log, const char* imageSetName, const char* imageSetDesc, const tcu::Surface& result, tcu::CompareLogMode logMode, RGBA color)
{
	bool isOk = true;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			if (result.getPixel(x, y).getRed()		!= color.getRed()	||
				result.getPixel(x, y).getGreen()	!= color.getGreen() ||
				result.getPixel(x, y).getBlue()		!= color.getBlue()	||
				result.getPixel(x, y).getAlpha()	!= color.getAlpha())
			{
				isOk = false;
			}
		}
	}

	if (!isOk || logMode == tcu::COMPARE_LOG_EVERYTHING)
	{
		if (!isOk)
			log << TestLog::Message << "Image comparison failed" << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result)
			<< TestLog::EndImageSet;
	}
	else if (logMode == tcu::COMPARE_LOG_RESULT)
		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result)
			<< TestLog::EndImageSet;

	return isOk;
}